

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_validation.h
# Opt level: O2

void Image_Function::
     VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
               (ImageTemplate<unsigned_char> *image,ImageTemplate<unsigned_char> *args,
               ImageTemplate<unsigned_char> *args_1)

{
  ImageTemplate<unsigned_char> local_40;
  
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_40,args_1);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (args,&local_40);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_40);
  return;
}

Assistant:

void VerifyGrayScaleImage( const TImage & image, Args... args)
    {
        VerifyGrayScaleImage( image );
        VerifyGrayScaleImage( args... );
    }